

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextbrowser.cpp
# Opt level: O1

QUrl __thiscall QTextBrowser::source(QTextBrowser *this)

{
  long lVar1;
  long in_RSI;
  
  lVar1 = *(long *)(*(long *)(in_RSI + 8) + 0x3d8);
  if (lVar1 == 0) {
    QUrl::QUrl((QUrl *)this);
  }
  else {
    QUrl::QUrl((QUrl *)this,
               (QUrl *)(*(long *)(*(long *)(in_RSI + 8) + 0x3d0) + lVar1 * 0x38 + -0x38));
  }
  return (QUrl)(QUrlPrivate *)this;
}

Assistant:

QUrl QTextBrowser::source() const
{
    Q_D(const QTextBrowser);
    if (d->stack.isEmpty())
        return QUrl();
    else
        return d->stack.top().url;
}